

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O2

HouseholderSequenceType * __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::householderQ
          (HouseholderSequenceType *__return_storage_ptr__,
          ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *this)

{
  long lVar1;
  long lVar2;
  
  if (this->m_isInitialized != false) {
    __return_storage_ptr__->m_vectors = &this->m_qr;
    __return_storage_ptr__->m_coeffs = &this->m_hCoeffs;
    __return_storage_ptr__->m_reverse = false;
    lVar1 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>.m_storage.
            m_rows;
    lVar2 = 8;
    if (lVar1 < 8) {
      lVar2 = lVar1;
    }
    __return_storage_ptr__->m_length = lVar2;
    __return_storage_ptr__->m_shift = 0;
    return __return_storage_ptr__;
  }
  __assert_fail("m_isInitialized && \"ColPivHouseholderQR is not initialized.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/QR/ColPivHouseholderQR.h"
                ,0x291,
                "typename ColPivHouseholderQR<MatrixType>::HouseholderSequenceType Eigen::ColPivHouseholderQR<Eigen::Matrix<float, -1, 8>>::householderQ() const [MatrixType = Eigen::Matrix<float, -1, 8>]"
               );
}

Assistant:

typename ColPivHouseholderQR<MatrixType>::HouseholderSequenceType ColPivHouseholderQR<MatrixType>
  ::householderQ() const
{
  eigen_assert(m_isInitialized && "ColPivHouseholderQR is not initialized.");
  return HouseholderSequenceType(m_qr, m_hCoeffs.conjugate());
}